

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall
wasm::Module::removeDataSegments(Module *this,function<bool_(wasm::DataSegment_*)> *pred)

{
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<bool_(wasm::DataSegment_*)>::function
            ((function<bool_(wasm::DataSegment_*)> *)&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>,std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>,wasm::DataSegment>
            (&this->dataSegments,&this->dataSegmentsMap,
             (function<bool_(wasm::DataSegment_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void Module::removeDataSegments(std::function<bool(DataSegment*)> pred) {
  removeModuleElements(dataSegments, dataSegmentsMap, pred);
}